

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_translation_L_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  DWORD DVar1;
  bool bVar2;
  FName local_78;
  DWORD local_74;
  char *pcStack_70;
  int tnum;
  char *str;
  int i;
  undefined1 local_58 [8];
  FRemapTable CurrentTranslation;
  int max;
  int trans;
  int type;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  AActor *defaults_local;
  
  if (params[1].i == 0) {
    DVar1 = params[2].i;
    CurrentTranslation.Inactive = true;
    CurrentTranslation._29_3_ = 0;
    if (((int)DVar1 < 0) || (6 < (int)DVar1)) {
      I_Error("Translation must be in the range [0,%d]",6);
    }
    DVar1 = TRANSLATION('\x03',DVar1);
    defaults->Translation = DVar1;
  }
  else {
    FRemapTable::FRemapTable((FRemapTable *)local_58,0x100);
    FRemapTable::MakeIdentity((FRemapTable *)local_58);
    for (str._0_4_ = 1; (int)str < params->i; str._0_4_ = (int)str + 1) {
      pcStack_70 = params[(int)str + 1].s;
      bVar2 = false;
      if (((int)str == 1) && (bVar2 = false, params->i == 2)) {
        FName::FName(&local_78,pcStack_70);
        local_74 = R_FindCustomTranslation(&local_78);
        bVar2 = local_74 != 0xffffffff;
      }
      if (bVar2) {
        defaults->Translation = local_74;
        goto LAB_0075327c;
      }
      FRemapTable::AddToTranslation((FRemapTable *)local_58,pcStack_70);
    }
    DVar1 = FRemapTable::StoreTranslation((FRemapTable *)local_58,7);
    defaults->Translation = DVar1;
LAB_0075327c:
    FRemapTable::~FRemapTable((FRemapTable *)local_58);
  }
  return;
}

Assistant:

DEFINE_PROPERTY(translation, L, Actor)
{
	PROP_INT_PARM(type, 0);

	if (type == 0)
	{
		PROP_INT_PARM(trans, 1);
		int max = 6;// (gameinfo.gametype == GAME_Strife || (info->GameFilter&GAME_Strife)) ? 6 : 2;
		if (trans < 0 || trans > max)
		{
			I_Error ("Translation must be in the range [0,%d]", max);
		}
		defaults->Translation = TRANSLATION(TRANSLATION_Standard, trans);
	}
	else 
	{
		FRemapTable CurrentTranslation;

		CurrentTranslation.MakeIdentity();
		for(int i = 1; i < PROP_PARM_COUNT; i++)
		{
			PROP_STRING_PARM(str, i);
			int tnum;
			if (i== 1 && PROP_PARM_COUNT == 2 && (tnum = R_FindCustomTranslation(str)) != -1)
			{
				defaults->Translation = tnum;
				return;
			}
			else
			{
				CurrentTranslation.AddToTranslation(str);
			}
		}
		defaults->Translation = CurrentTranslation.StoreTranslation (TRANSLATION_Decorate);
	}
}